

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall CServer::SendMap(CServer *this,int ClientID)

{
  long lVar1;
  char *pStr;
  long in_FS_OFFSET;
  CMsgPacker Msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMsgPacker::CMsgPacker(&Msg,2,true);
  pStr = GetMapName(this);
  CPacker::AddString(&Msg.super_CPacker,pStr,0);
  CPacker::AddInt(&Msg.super_CPacker,this->m_CurrentMapCrc);
  CPacker::AddInt(&Msg.super_CPacker,this->m_CurrentMapSize);
  CPacker::AddInt(&Msg.super_CPacker,this->m_MapChunksPerRequest);
  CPacker::AddInt(&Msg.super_CPacker,0x568);
  CPacker::AddRaw(&Msg.super_CPacker,&this->m_CurrentMapSha256,0x20);
  (*(this->super_IServer).super_IInterface._vptr_IInterface[9])(this,&Msg,3,ClientID);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServer::SendMap(int ClientID)
{
	CMsgPacker Msg(NETMSG_MAP_CHANGE, true);
	Msg.AddString(GetMapName(), 0);
	Msg.AddInt(m_CurrentMapCrc);
	Msg.AddInt(m_CurrentMapSize);
	Msg.AddInt(m_MapChunksPerRequest);
	Msg.AddInt(MAP_CHUNK_SIZE);
	Msg.AddRaw(&m_CurrentMapSha256, sizeof(m_CurrentMapSha256));
	SendMsg(&Msg, MSGFLAG_VITAL|MSGFLAG_FLUSH, ClientID);
}